

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionParser.cpp
# Opt level: O0

unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>
andExpression(Tokenizer *tokenizer)

{
  bool bVar1;
  Token *pTVar2;
  __uniq_ptr_data<ExpressionInternal,_std::default_delete<ExpressionInternal>,_true,_true> in_RSI;
  undefined1 local_4c [12];
  undefined1 local_40 [8];
  unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_> exp2;
  unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_> exp;
  Tokenizer *tokenizer_local;
  
  exp._M_t.super___uniq_ptr_impl<ExpressionInternal,_std::default_delete<ExpressionInternal>_>._M_t.
  super__Tuple_impl<0UL,_ExpressionInternal_*,_std::default_delete<ExpressionInternal>_>.
  super__Head_base<0UL,_ExpressionInternal_*,_false>._M_head_impl =
       (__uniq_ptr_data<ExpressionInternal,_std::default_delete<ExpressionInternal>,_true,_true>)
       (__uniq_ptr_data<ExpressionInternal,_std::default_delete<ExpressionInternal>,_true,_true>)
       in_RSI.super___uniq_ptr_impl<ExpressionInternal,_std::default_delete<ExpressionInternal>_>.
       _M_t.super__Tuple_impl<0UL,_ExpressionInternal_*,_std::default_delete<ExpressionInternal>_>.
       super__Head_base<0UL,_ExpressionInternal_*,_false>._M_head_impl;
  equalityExpression((Tokenizer *)&stack0xffffffffffffffe0);
  bVar1 = std::operator==((unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>
                           *)&stack0xffffffffffffffe0,(nullptr_t)0x0);
  if (bVar1) {
    std::unique_ptr<ExpressionInternal,std::default_delete<ExpressionInternal>>::
    unique_ptr<std::default_delete<ExpressionInternal>,void>
              ((unique_ptr<ExpressionInternal,std::default_delete<ExpressionInternal>> *)tokenizer,
               (nullptr_t)0x0);
  }
  else {
    do {
      pTVar2 = Tokenizer::peekToken
                         ((Tokenizer *)
                          exp._M_t.
                          super___uniq_ptr_impl<ExpressionInternal,_std::default_delete<ExpressionInternal>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_ExpressionInternal_*,_std::default_delete<ExpressionInternal>_>
                          .super__Head_base<0UL,_ExpressionInternal_*,_false>._M_head_impl,0);
      if (pTVar2->type != BitAnd) {
        std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>::unique_ptr
                  ((unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_> *)
                   tokenizer,
                   (unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_> *)
                   &stack0xffffffffffffffe0);
        break;
      }
      Tokenizer::eatToken((Tokenizer *)
                          exp._M_t.
                          super___uniq_ptr_impl<ExpressionInternal,_std::default_delete<ExpressionInternal>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_ExpressionInternal_*,_std::default_delete<ExpressionInternal>_>
                          .super__Head_base<0UL,_ExpressionInternal_*,_false>._M_head_impl);
      equalityExpression((Tokenizer *)local_40);
      bVar1 = std::operator==((unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>
                               *)local_40,(nullptr_t)0x0);
      if (bVar1) {
        std::unique_ptr<ExpressionInternal,std::default_delete<ExpressionInternal>>::
        unique_ptr<std::default_delete<ExpressionInternal>,void>
                  ((unique_ptr<ExpressionInternal,std::default_delete<ExpressionInternal>> *)
                   tokenizer,(nullptr_t)0x0);
      }
      else {
        local_4c._0_4_ = 0x16;
        std::
        make_unique<ExpressionInternal,OperatorType,std::unique_ptr<ExpressionInternal,std::default_delete<ExpressionInternal>>,std::unique_ptr<ExpressionInternal,std::default_delete<ExpressionInternal>>>
                  ((OperatorType *)(local_4c + 4),
                   (unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_> *)
                   local_4c,(unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>
                             *)&stack0xffffffffffffffe0);
        std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>::operator=
                  ((unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_> *)
                   &stack0xffffffffffffffe0,
                   (unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_> *)
                   (local_4c + 4));
        std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>::~unique_ptr
                  ((unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_> *)
                   (local_4c + 4));
      }
      std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>::~unique_ptr
                ((unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_> *)
                 local_40);
    } while (!bVar1);
  }
  std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>::~unique_ptr
            ((unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_> *)
             &stack0xffffffffffffffe0);
  return (__uniq_ptr_data<ExpressionInternal,_std::default_delete<ExpressionInternal>,_true,_true>)
         (__uniq_ptr_data<ExpressionInternal,_std::default_delete<ExpressionInternal>,_true,_true>)
         tokenizer;
}

Assistant:

static std::unique_ptr<ExpressionInternal> andExpression(Tokenizer& tokenizer)
{
	std::unique_ptr<ExpressionInternal> exp = equalityExpression(tokenizer);
	if (exp == nullptr)
		return nullptr;

	while (tokenizer.peekToken().type == TokenType::BitAnd)
	{
		tokenizer.eatToken();

		std::unique_ptr<ExpressionInternal> exp2 = equalityExpression(tokenizer);
		if (exp2 == nullptr)
			return nullptr;

		exp = std::make_unique<ExpressionInternal>(OperatorType::BitAnd, std::move(exp), std::move(exp2));
	}

	return exp;
}